

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

void __thiscall djb::tab_r::compute_cdf(tab_r *this)

{
  vector<djb::vec2,_std::allocator<djb::vec2>_> *this_00;
  undefined8 uVar1;
  int i1;
  int iVar2;
  long lVar3;
  long lVar4;
  int i2;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float extraout_XMM0_Da;
  float fVar13;
  float fVar14;
  vec2 local_48;
  long local_40;
  long local_38;
  
  this_00 = &this->m_cdf;
  lVar4 = 0;
  lVar5 = 0;
  while (lVar5 != 0x10) {
    fVar7 = SQRT((float)(int)lVar5 / 15.0) * 3.1415927 * 0.5;
    local_40 = lVar5;
    fVar8 = cosf(fVar7);
    fVar10 = 0.0;
    if (0.0 <= fVar8) {
      fVar10 = fVar8;
    }
    fVar7 = sinf(fVar7);
    iVar2 = 0x40;
    while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
      local_48.x = 0.0;
      local_48.y = 0.0;
      std::vector<djb::vec2,_std::allocator<djb::vec2>_>::emplace_back<djb::vec2>(this_00,&local_48)
      ;
    }
    fVar8 = 1.0;
    if (fVar10 <= 1.0) {
      fVar8 = fVar10;
    }
    local_38 = lVar4;
    for (lVar5 = 1; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      fVar9 = (float)(int)lVar5 * 0.00390625;
      fVar10 = fVar9 * fVar9 * 3.1415927 * 0.5;
      fVar11 = cosf(fVar10);
      fVar12 = sinf(fVar10);
      (*(this->super_radial).super_microfacet.super_brdf._vptr_brdf[0xe])((ulong)(uint)fVar11,this);
      fVar10 = 0.0;
      for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
        fVar13 = (float)(int)lVar3 * 0.015625;
        fVar13 = (fVar13 + fVar13 + -1.0) * 3.1415927;
        fVar14 = cosf(fVar13);
        fVar13 = sinf(fVar13);
        fVar14 = fVar14 * fVar12 * fVar7 + fVar13 * fVar12 * 0.0 + fVar11 * fVar8;
        fVar13 = 0.0;
        if (0.0 <= fVar14) {
          fVar13 = fVar14;
        }
        fVar14 = 1.0;
        if (fVar13 <= 1.0) {
          fVar14 = fVar13;
        }
        fVar13 = fVar14 * extraout_XMM0_Da * fVar9 * fVar12;
        fVar10 = fVar10 + fVar13;
        uVar1 = *(undefined8 *)
                 ((long)&(this_00->super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>).
                         _M_impl.super__Vector_impl_data._M_start[lVar3].x + lVar4);
        local_48.x = fVar10 * 0.024543693 * 0.049087387 + (float)uVar1;
        local_48.y = fVar13 * 0.049087387 + (float)((ulong)uVar1 >> 0x20);
        std::vector<djb::vec2,_std::allocator<djb::vec2>_>::emplace_back<djb::vec2>
                  (this_00,&local_48);
      }
      lVar4 = lVar4 + 0x200;
    }
    lVar4 = local_38 + 0x20000;
    lVar5 = local_40 + 1;
  }
  fwrite("djb_verbose: CDF ready\n",0x17,1,_stdout);
  return;
}

Assistant:

void tab_r::compute_cdf()
{
	int nti = 16;
	int nu2 = 256;
	int nu1 = 64;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i3 = 0; i3 < nti; ++i3) {
		float_t u = (float_t)i3 / (nti - 1); // in [0,1]
		float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
		float_t zi = sat(cos(ti)), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		// bottom row (zeroes)
		for (int i1 = 0; i1 < nu1; ++i1)
			m_cdf.push_back(vec2(0));

		// rest of the domain
		for (int i2 = 1; i2 < nu2; ++i2) {
			float_t u2 = (float_t)i2 / nu2;   // in (0,1)
			float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
			float_t ctm = cos(tm), stm = sin(tm);
			float_t ndf = ndf_std_radial(ctm);
			double nint = 0;

			for (int i1 = 0; i1 < nu1; ++i1) {
				float_t u1 = (float_t)i1 / nu1;    // in [0,1)
				float_t pm = (2 * u1 - 1) * m_pi();  // in [-pi,pi)
				float_t cpm = cos(pm), spm = sin(pm);
				vec3 wm = vec3(stm * cpm, stm * spm, ctm);
				float_t dp = sat(dot(wm, wi));
				vec2 nint2 = m_cdf[i1 + nu1 * (i2 - 1 + nu2 * i3)];
				float_t tmp = dp * ndf * u2 * stm;

				nint+= (double)tmp;
				m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}